

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O3

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  long lVar1;
  pointer ppFVar2;
  FieldDescriptor FVar3;
  bool bVar4;
  int iVar5;
  Reflection *this_00;
  UnknownFieldSet *this_01;
  Descriptor *pDVar6;
  MapFieldBase *this_02;
  Message *pMVar7;
  int index;
  pointer ppFVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_d8;
  MapIterator local_c0;
  MapIterator local_78;
  
  this_00 = GetReflectionOrDie(message);
  this_01 = Reflection::MutableUnknownFields(this_00,message);
  if ((this_01->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this_01->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    UnknownFieldSet::ClearFallback(this_01);
  }
  local_d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,message,&local_d8);
  ppFVar2 = local_d8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar8 = local_d8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppFVar8 == ppFVar2) {
      if (local_d8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    this = *ppFVar8;
    if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
      local_c0.iter_ = FieldDescriptor::TypeOnceInit;
      local_78.iter_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c0,
                 (FieldDescriptor **)&local_78);
    }
    FVar3 = this[2];
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)FVar3 * 4) == 10) {
      if (*(once_flag **)(this + 0x18) != (once_flag *)0x0) {
        local_c0.iter_ = FieldDescriptor::TypeOnceInit;
        local_78.iter_ = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x18),(_func_void_FieldDescriptor_ptr **)&local_c0,
                   (FieldDescriptor **)&local_78);
        FVar3 = this[2];
      }
      if ((FVar3 == (FieldDescriptor)0xb) &&
         (bVar4 = FieldDescriptor::is_map_message_type(this), bVar4)) {
        pDVar6 = FieldDescriptor::message_type(this);
        lVar1 = *(long *)(pDVar6 + 0x28);
        if (*(once_flag **)(lVar1 + 0x60) != (once_flag *)0x0) {
          local_78.iter_ = (void *)(lVar1 + 0x48);
          local_c0.iter_ = FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(lVar1 + 0x60),(_func_void_FieldDescriptor_ptr **)&local_c0,
                     (FieldDescriptor **)&local_78);
        }
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)(lVar1 + 0x4a) * 4) == 10)
        {
          this_02 = Reflection::MutableMapData(this_00,message,this);
          bVar4 = MapFieldBase::IsMapValid(this_02);
          if (bVar4) {
            MapIterator::MapIterator(&local_c0,message,this);
            MapIterator::MapIterator(&local_78,message,this);
            (*this_02->_vptr_MapFieldBase[7])(this_02,&local_c0);
            (*this_02->_vptr_MapFieldBase[8])(this_02,&local_78);
            while (iVar5 = (*(local_c0.map_)->_vptr_MapFieldBase[6])
                                     (local_c0.map_,&local_c0,&local_78), (char)iVar5 == '\0') {
              MapFieldBase::SetMapDirty(local_c0.map_);
              pMVar7 = MapValueRef::MutableMessageValue(&local_c0.value_);
              Message::DiscardUnknownFields(pMVar7);
              (*(local_c0.map_)->_vptr_MapFieldBase[0x14])(local_c0.map_,&local_c0);
            }
            MapIterator::~MapIterator(&local_78);
            MapIterator::~MapIterator(&local_c0);
          }
          goto LAB_003ac9cf;
        }
      }
      if ((~(byte)this[1] & 0x60) == 0) {
        iVar5 = Reflection::FieldSize(this_00,message,this);
        if (0 < iVar5) {
          index = 0;
          do {
            pMVar7 = Reflection::MutableRepeatedMessage(this_00,message,this,index);
            Message::DiscardUnknownFields(pMVar7);
            index = index + 1;
          } while (iVar5 != index);
        }
      }
      else {
        pMVar7 = Reflection::MutableMessage(this_00,message,this,(MessageFactory *)0x0);
        Message::DiscardUnknownFields(pMVar7);
      }
    }
LAB_003ac9cf:
    ppFVar8 = ppFVar8 + 1;
  } while( true );
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  reflection->MutableUnknownFields(message)->Clear();

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    if (field->is_map() && IsMapValueMessageTyped(field)) {
      const MapFieldBase* map_field =
          reflection->MutableMapData(message, field);
      if (map_field->IsMapValid()) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}